

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressEnd_public
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  size_t err_code;
  size_t sVar1;
  size_t extraCSize;
  XXH64_hash_t XVar2;
  undefined4 *puVar3;
  ulong uVar4;
  size_t err_code_1;
  undefined4 *dst_00;
  
  sVar1 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar1) {
    return sVar1;
  }
  if (cctx->stage == ZSTDcs_created) {
    extraCSize = 0xffffffffffffffc4;
  }
  else {
    dst_00 = (undefined4 *)((long)dst + sVar1);
    uVar4 = dstCapacity - sVar1;
    puVar3 = dst_00;
    if (cctx->stage == ZSTDcs_init) {
      extraCSize = ZSTD_writeFrameHeader(dst_00,uVar4,&cctx->appliedParams,0,0);
      if (0xffffffffffffff88 < extraCSize) goto LAB_001be19d;
      uVar4 = uVar4 - extraCSize;
      cctx->stage = ZSTDcs_ongoing;
      puVar3 = (undefined4 *)(extraCSize + (long)dst_00);
    }
    if (cctx->stage != ZSTDcs_ending) {
      if (uVar4 < 4) {
        extraCSize = 0xffffffffffffffba;
        goto LAB_001be19d;
      }
      *puVar3 = 1;
      puVar3 = (undefined4 *)((long)puVar3 + 3);
      uVar4 = uVar4 - 3;
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar2 = ZSTD_XXH64_digest(&cctx->xxhState);
      if (uVar4 < 4) {
        extraCSize = 0xffffffffffffffba;
        goto LAB_001be19d;
      }
      *puVar3 = (int)XVar2;
      puVar3 = puVar3 + 1;
    }
    cctx->stage = ZSTDcs_created;
    extraCSize = (long)puVar3 - (long)dst_00;
  }
LAB_001be19d:
  uVar4 = extraCSize;
  if (extraCSize < 0xffffffffffffff89) {
    if (((cctx->appliedParams).fParams.contentSizeFlag != 0) && (cctx->pledgedSrcSizePlusOne == 0))
    {
      __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x143c,
                    "size_t ZSTD_compressEnd_public(ZSTD_CCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if ((cctx->pledgedSrcSizePlusOne == 0) ||
       (uVar4 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)) {
      ZSTD_CCtx_trace(cctx,extraCSize);
      uVar4 = sVar1 + extraCSize;
    }
  }
  return uVar4;
}

Assistant:

size_t ZSTD_compressEnd_public(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}